

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O2

void __thiscall MT32Emu::Poly::partialDeactivated(Poly *this,Partial *partial)

{
  uint uVar1;
  Synth *pSVar2;
  long lVar3;
  
  uVar1 = this->activePartialCount;
  for (lVar3 = 4; lVar3 != 8; lVar3 = lVar3 + 1) {
    if (this->partials[lVar3 + -4] == partial) {
      this->partials[lVar3 + -4] = (Partial *)0x0;
      uVar1 = uVar1 - 1;
      this->activePartialCount = uVar1;
    }
  }
  if (uVar1 == 0) {
    setState(this,POLY_Inactive);
    pSVar2 = Part::getSynth(this->part);
    if (pSVar2->abortingPoly == this) {
      pSVar2 = Part::getSynth(this->part);
      pSVar2->abortingPoly = (Poly *)0x0;
    }
  }
  Part::partialDeactivated(this->part,this);
  return;
}

Assistant:

void Poly::partialDeactivated(Partial *partial) {
	for (int i = 0; i < 4; i++) {
		if (partials[i] == partial) {
			partials[i] = NULL;
			activePartialCount--;
		}
	}
	if (activePartialCount == 0) {
		setState(POLY_Inactive);
		if (part->getSynth()->abortingPoly == this) {
			part->getSynth()->abortingPoly = NULL;
		}
	}
	part->partialDeactivated(this);
}